

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

Literal * fromBinaryenLiteral(BinaryenLiteral x)

{
  int32_t init;
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  Literal *in_RDI;
  HeapType in_R8;
  Name func;
  TypeID in_stack_00000008;
  Name local_78;
  uintptr_t local_68;
  HeapType local_60;
  HeapType heapType;
  Literal local_30;
  Type local_18;
  Type type;
  
  wasm::Type::Type(&local_18,in_stack_00000008);
  bVar1 = wasm::Type::isBasic(&local_18);
  if (bVar1) {
    BVar2 = wasm::Type::getBasic(&local_18);
    init = (int32_t)x.type;
    switch(BVar2) {
    case none:
    case unreachable:
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                 ,0x81);
    case i32:
      wasm::Literal::Literal(in_RDI,init);
      break;
    case i64:
      wasm::Literal::Literal(in_RDI,x.type);
      break;
    case f32:
      wasm::Literal::Literal(&local_30,init);
      wasm::Literal::castToF32(in_RDI,&local_30);
      wasm::Literal::~Literal(&local_30);
      break;
    case f64:
      wasm::Literal::Literal((Literal *)&heapType,x.type);
      wasm::Literal::castToF64(in_RDI,(Literal *)&heapType);
      wasm::Literal::~Literal((Literal *)&heapType);
      break;
    case v128:
      wasm::Literal::Literal(in_RDI,(uint8_t *)&x);
      break;
    default:
      goto switchD_026ec436_default;
    }
  }
  else {
switchD_026ec436_default:
    bVar1 = wasm::Type::isRef(&local_18);
    if (!bVar1) {
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0x84,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    local_60 = wasm::Type::getHeapType(&local_18);
    bVar1 = wasm::HeapType::isBasic(&local_60);
    if (bVar1) {
      BVar3 = wasm::HeapType::getBasic(&local_60,Unshared);
      switch(BVar3) {
      case ext:
      case any:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x8c);
      default:
        break;
      case func:
      case cont:
      case eq:
      case struct_:
      case array:
      case exn:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x93);
      case i31:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x89);
      case string:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x95);
      case none:
      case noext:
      case nofunc:
      case nocont:
      case noexn:
        bVar1 = wasm::Type::isNullable(&local_18);
        if (bVar1) {
          local_68 = local_60.id;
          wasm::Literal::makeNull(in_RDI,local_60);
          return in_RDI;
        }
        __assert_fail("type.isNullable()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                      ,0x9b,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
    }
    bVar1 = wasm::HeapType::isSignature(&local_60);
    if (!bVar1) {
      bVar1 = wasm::HeapType::isData(&local_60);
      if (bVar1) {
        wasm::handle_unreachable
                  ("TODO: gc data",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0xa3);
      }
      __assert_fail("heapType.isData()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0xa2,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    wasm::Name::Name(&local_78,(char *)x.type);
    func.super_IString.str._M_str = (char *)local_60.id;
    func.super_IString.str._M_len = (size_t)local_78.super_IString.str._M_str;
    wasm::Literal::makeFunc(in_RDI,(Literal *)local_78.super_IString.str._M_len,func,in_R8);
  }
  return in_RDI;
}

Assistant:

Literal fromBinaryenLiteral(BinaryenLiteral x) {
  auto type = Type(x.type);
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(x.i32);
      case Type::i64:
        return Literal(x.i64);
      case Type::f32:
        return Literal(x.i32).castToF32();
      case Type::f64:
        return Literal(x.i64).castToF64();
      case Type::v128:
        return Literal(x.v128);
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(type.isRef());
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
      case HeapType::any:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        assert(type.isNullable());
        return Literal::makeNull(heapType);
    }
  }
  if (heapType.isSignature()) {
    return Literal::makeFunc(Name(x.func), heapType);
  }
  assert(heapType.isData());
  WASM_UNREACHABLE("TODO: gc data");
}